

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

void mkundead(level *lev,coord *mm,boolean revive_corpses,int mm_flags)

{
  xchar xVar1;
  boolean bVar2;
  int iVar3;
  permonst *mdat_00;
  monst *pmVar4;
  coord local_3a;
  obj *poStack_38;
  coord cc;
  obj *otmp;
  permonst *mdat;
  int cnt;
  int mm_flags_local;
  boolean revive_corpses_local;
  coord *mm_local;
  level *lev_local;
  
  xVar1 = level_difficulty(&lev->z);
  iVar3 = rnd(5);
  mdat._4_4_ = (xVar1 + 1) / 10 + iVar3;
  while (iVar3 = mdat._4_4_ + -1, mdat._4_4_ != 0) {
    mdat_00 = morguemon(&lev->z);
    bVar2 = enexto(&local_3a,lev,mm->x,mm->y,mdat_00);
    mdat._4_4_ = iVar3;
    if ((bVar2 != '\0') &&
       (((revive_corpses == '\0' ||
         (poStack_38 = sobj_at(0x10e,lev,(int)local_3a.x,(int)local_3a.y), poStack_38 == (obj *)0x0)
         ) || (pmVar4 = revive(poStack_38), pmVar4 == (monst *)0x0)))) {
      makemon(mdat_00,lev,(int)local_3a.x,(int)local_3a.y,mm_flags);
    }
  }
  *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xfffeffff | 0x10000;
  return;
}

Assistant:

void mkundead(struct level *lev, coord *mm, boolean revive_corpses, int mm_flags)
{
	int cnt = (level_difficulty(&lev->z) + 1)/10 + rnd(5);
	const struct permonst *mdat;
	struct obj *otmp;
	coord cc;

	while (cnt--) {
	    mdat = morguemon(&lev->z);
	    if (enexto(&cc, lev, mm->x, mm->y, mdat) &&
		    (!revive_corpses ||
		     !(otmp = sobj_at(CORPSE, lev, cc.x, cc.y)) ||
		     !revive(otmp)))
		makemon(mdat, lev, cc.x, cc.y, mm_flags);
	}
	lev->flags.graveyard = TRUE;	/* reduced chance for undead corpse */
}